

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O3

void __thiscall
ApprovalTests::ApprovalMissingException::ApprovalMissingException
          (ApprovalMissingException *this,string *param_1,string *approved)

{
  string local_38;
  
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_00163ab8;
  format(&local_38,(ApprovalMissingException *)param_1,approved);
  ApprovalException::ApprovalException(&this->super_ApprovalException,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_00163ab8;
  return;
}

Assistant:

ApprovalMissingException::ApprovalMissingException(const std::string&,
                                                       const std::string& approved)
        : ApprovalException(format(approved))
    {
    }